

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeLoop
          (InstructionCreater *this,Node *node,Element *refelt)

{
  size_t *psVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  pointer ppuVar4;
  pointer ppuVar5;
  InstructionData *instdata;
  uint_t uVar6;
  pointer ppuVar7;
  size_t local_38;
  
  local_38 = node->index;
  psVar1 = (this->LoopBreakIDs).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar1 == (this->LoopBreakIDs).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(this->LoopBreakIDs).c,&local_38);
  }
  else {
    *psVar1 = local_38;
    (this->LoopBreakIDs).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = psVar1 + 1;
  }
  ppIVar2 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar3 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  createReferNode(this,(node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  instdata = (InstructionData *)operator_new(0x18);
  instdata->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata->Inst = 0;
  instdata[1]._vptr_InstructionData = (_func_int **)0x0;
  instdata->Inst = jump;
  instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e00;
  Instruction::InstructionList::push(&this->InstList,instdata);
  instdata[1]._vptr_InstructionData = (_func_int **)((long)ppIVar2 - (long)ppIVar3 >> 3);
  Instruction::InstructionList::push(&this->InstList,nop);
  if ((refelt->field_0).field_0.etype != '\x02') {
    __assert_fail("isRefer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                  ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
  }
  uVar6 = ((long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  refelt->index = uVar6;
  ppuVar4 = (this->LoopBreakJumpPtrs).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppuVar5 = (this->LoopBreakJumpPtrs).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppuVar7 = ppuVar4;
  if (ppuVar4 != ppuVar5) {
    do {
      **ppuVar7 = uVar6;
      ppuVar7 = ppuVar7 + 1;
    } while (ppuVar7 != ppuVar5);
    if (ppuVar4 != ppuVar5) {
      (this->LoopBreakJumpPtrs).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppuVar4;
    }
  }
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->LoopBreakIDs).c);
  return true;
}

Assistant:

bool createNodeLoop(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Rdo = node[1];
				size_t index = NextInstID();
				createReferNode(Rdo);
				auto *jpinst = new Insts::Jump();
				InstList.push(jpinst);
				jpinst->Index = index;
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}